

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  pointer pPVar1;
  size_t sVar2;
  ostream *poVar3;
  int iVar4;
  size_t i;
  pointer tip_pos;
  ulong uVar5;
  pointer puVar6;
  int in_R8D;
  vector<unsigned_long,_std::allocator<unsigned_long>_> arrow_point;
  arrows_position arrows_found;
  Mat image_test;
  int local_930;
  int local_92c;
  long local_928;
  Mat image_test_gray;
  array<cv::RotatedRect,_10UL> target_ellipses;
  undefined1 local_7b0 [16];
  undefined8 local_7a0;
  array<cv::Mat,_10UL> target_ring_mask;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_7b0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Surrog[P]ArcheryCounter/Images/\\20190325_204137.jpg"
             ,(allocator<char> *)&target_ring_mask);
  cv::imread((string *)&image_test,(int)local_7b0);
  std::__cxx11::string::~string((string *)local_7b0);
  if (local_928 == 0) {
    puts("No image data");
    iVar4 = -1;
  }
  else {
    cv::Mat::Mat(&image_test_gray);
    local_7a0 = 0;
    target_ring_mask._16_8_ = 0;
    local_7b0._0_4_ = 2.3693558e-38;
    target_ring_mask._0_4_ = 0x2010000;
    local_7b0._8_8_ = &image_test;
    target_ring_mask._8_8_ = &image_test_gray;
    cv::cvtColor((cv *)local_7b0,(_InputArray *)&target_ring_mask,(_OutputArray *)0x6,0,in_R8D);
    ellipses::find_target(&target_ellipses,&image_test,false);
    compute_target_ring_mask(&target_ring_mask,&target_ellipses,local_930,local_92c,false);
    arrows_found.fletching.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    arrows_found.fletching.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    arrows_found.tip.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    arrows_found.fletching.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    arrows_found.tip.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    arrows_found.tip.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    ellipses::display_ellipses<cv::RotatedRect*>
              (&image_test,target_ellipses._M_elems,(RotatedRect *)local_7b0);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&arrow_point,0,(allocator_type *)local_7b0);
    pPVar1 = arrows_found.tip.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    puVar6 = arrow_point.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (tip_pos = arrows_found.tip.
                   super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
                   super__Vector_impl_data._M_start; tip_pos != pPVar1; tip_pos = tip_pos + 1) {
      std::array<cv::Mat,_10UL>::array((array<cv::Mat,_10UL> *)local_7b0,&target_ring_mask);
      sVar2 = get_arrow_point(tip_pos,(array<cv::Mat,_10UL> *)local_7b0);
      std::array<cv::Mat,_10UL>::~array((array<cv::Mat,_10UL> *)local_7b0);
      *puVar6 = sVar2;
      puVar6 = puVar6 + 1;
    }
    for (uVar5 = 0;
        uVar5 < (ulong)((long)arrow_point.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)arrow_point.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 3); uVar5 = uVar5 + 1) {
      poVar3 = std::operator<<((ostream *)&std::cout,"arrow ");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::operator<<(poVar3,'\n');
    }
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&arrow_point.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    NN::arrows_position::~arrows_position(&arrows_found);
    std::array<cv::Mat,_10UL>::~array(&target_ring_mask);
    cv::Mat::~Mat(&image_test_gray);
    iVar4 = 0;
  }
  cv::Mat::~Mat(&image_test);
  return iVar4;
}

Assistant:

int main(int argc, char** argv)
{
    cv::Mat image_test = cv::imread(test, cv::IMREAD_COLOR);

    if(!image_test.data)
    {
        printf("No image data\n");
        return -1;
    }

    cv::Mat image_test_gray;
    cv::cvtColor(image_test, image_test_gray, cv::COLOR_BGR2GRAY);

    std::array<cv::RotatedRect, 10> target_ellipses = ellipses::find_target(image_test, false);

    std::array<cv::Mat, 10> target_ring_mask
        = compute_target_ring_mask(target_ellipses, image_test.rows, image_test.cols);

    auto arrows_found = NN::find_arrows(image_test, image_test_gray, target_ring_mask);

    ellipses::display_ellipses(image_test, target_ellipses.begin(), target_ellipses.end());

    assert(arrows_found.tip.size() == arrows_found.fletching.size());

    std::vector<std::size_t> arrow_point(arrows_found.tip.size());
    std::transform(arrows_found.tip.begin(), arrows_found.tip.end(), arrow_point.begin(),
        [&target_ring_mask](const cv::Point& tip_pos) { return get_arrow_point(tip_pos, target_ring_mask); });

	for(std::size_t i = 0; i < arrow_point.size();                                                                       i++)
    {
        std::cout << "arrow " << i << arrow_point[i] << '\n';
    }

    return 0;
}